

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void uv__signal_stop(uv_signal_t *handle)

{
  uint *puVar1;
  uint uVar2;
  uv_signal_s *puVar3;
  uv_signal_s *puVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  uv_signal_s *puVar8;
  uv_signal_t *puVar9;
  uv__signal_tree_s uVar10;
  uv_signal_s *puVar11;
  uv_signal_s *puVar12;
  uv_signal_s *old;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar13;
  sigset_t saved_sigmask;
  sigaction local_b0;
  
  if (handle->signum == 0) {
    return;
  }
  uv__signal_block_and_lock(&saved_sigmask);
  puVar12 = (handle->tree_entry).rbe_left;
  puVar8 = (handle->tree_entry).rbe_right;
  if (puVar12 == (uv_signal_s *)0x0) {
    puVar11 = (handle->tree_entry).rbe_parent;
    iVar7 = (handle->tree_entry).rbe_color;
    if (puVar8 != (uv_signal_s *)0x0) goto LAB_001b9297;
    puVar8 = (uv_signal_s *)0x0;
  }
  else {
    if (puVar8 != (uv_signal_s *)0x0) {
      do {
        puVar12 = puVar8;
        puVar8 = (puVar12->tree_entry).rbe_left;
      } while (puVar8 != (uv_signal_s *)0x0);
      puVar8 = (puVar12->tree_entry).rbe_right;
      puVar11 = (puVar12->tree_entry).rbe_parent;
      iVar7 = (puVar12->tree_entry).rbe_color;
      if (puVar8 != (uv_signal_s *)0x0) {
        (puVar8->tree_entry).rbe_parent = puVar11;
      }
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar11 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
        if ((puVar11->tree_entry).rbe_left == puVar12) {
          paVar13 = &puVar11->tree_entry;
        }
      }
      paVar13->rbe_left = puVar8;
      if ((puVar12->tree_entry).rbe_parent == handle) {
        puVar11 = puVar12;
      }
      puVar3 = (handle->tree_entry).rbe_left;
      puVar4 = (handle->tree_entry).rbe_right;
      iVar5 = (handle->tree_entry).rbe_color;
      uVar6 = *(undefined4 *)&(handle->tree_entry).field_0x1c;
      (puVar12->tree_entry).rbe_parent = (handle->tree_entry).rbe_parent;
      (puVar12->tree_entry).rbe_color = iVar5;
      *(undefined4 *)&(puVar12->tree_entry).field_0x1c = uVar6;
      (puVar12->tree_entry).rbe_left = puVar3;
      (puVar12->tree_entry).rbe_right = puVar4;
      puVar3 = (handle->tree_entry).rbe_parent;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      if (puVar3 != (uv_signal_s *)0x0) {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar3->tree_entry).rbe_right;
        if ((puVar3->tree_entry).rbe_left == handle) {
          paVar13 = &puVar3->tree_entry;
        }
      }
      paVar13->rbe_left = puVar12;
      (((handle->tree_entry).rbe_left)->tree_entry).rbe_parent = puVar12;
      puVar3 = (handle->tree_entry).rbe_right;
      if (puVar3 != (uv_signal_s *)0x0) {
        (puVar3->tree_entry).rbe_parent = puVar12;
      }
      puVar12 = puVar11;
      if (puVar11 == (uv_signal_s *)0x0) {
        puVar11 = (uv_signal_s *)0x0;
      }
      else {
        do {
          puVar12 = (puVar12->tree_entry).rbe_parent;
        } while (puVar12 != (uv_signal_s *)0x0);
      }
      goto LAB_001b92c4;
    }
    puVar11 = (handle->tree_entry).rbe_parent;
    iVar7 = (handle->tree_entry).rbe_color;
    puVar8 = puVar12;
LAB_001b9297:
    (puVar8->tree_entry).rbe_parent = puVar11;
  }
  if (puVar11 == (uv_signal_s *)0x0) {
    paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
  }
  else {
    paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
    if ((puVar11->tree_entry).rbe_left == handle) {
      paVar13 = &puVar11->tree_entry;
    }
  }
  paVar13->rbe_left = puVar8;
LAB_001b92c4:
  uVar10.rbh_root = uv__signal_tree.rbh_root;
  if (iVar7 == 0) {
    while( true ) {
      if (puVar8 == (uv_signal_s *)0x0) {
        if (uVar10.rbh_root == (uv_signal_s *)0x0) goto LAB_001b95d5;
      }
      else if (((puVar8->tree_entry).rbe_color != 0) || (puVar8 == uVar10.rbh_root))
      goto LAB_001b95d1;
      puVar12 = (puVar11->tree_entry).rbe_left;
      if (puVar12 == puVar8) {
        puVar12 = (puVar11->tree_entry).rbe_right;
        if ((puVar12->tree_entry).rbe_color == 1) {
          (puVar12->tree_entry).rbe_color = 0;
          (puVar11->tree_entry).rbe_color = 1;
          puVar12 = (puVar11->tree_entry).rbe_right;
          puVar8 = (puVar12->tree_entry).rbe_left;
          (puVar11->tree_entry).rbe_right = puVar8;
          if (puVar8 != (uv_signal_s *)0x0) {
            (puVar8->tree_entry).rbe_parent = puVar11;
          }
          puVar8 = (puVar11->tree_entry).rbe_parent;
          (puVar12->tree_entry).rbe_parent = puVar8;
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          puVar3 = puVar12;
          if (puVar8 != (uv_signal_s *)0x0) {
            paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar8->tree_entry).rbe_right;
            puVar3 = uVar10.rbh_root;
            if (puVar11 == (puVar8->tree_entry).rbe_left) {
              paVar13 = &puVar8->tree_entry;
            }
          }
          uVar10.rbh_root = puVar3;
          paVar13->rbe_left = puVar12;
          (puVar12->tree_entry).rbe_left = puVar11;
          (puVar11->tree_entry).rbe_parent = puVar12;
          puVar12 = (puVar11->tree_entry).rbe_right;
        }
        puVar8 = (puVar12->tree_entry).rbe_left;
        if ((puVar8 == (uv_signal_s *)0x0) || ((puVar8->tree_entry).rbe_color == 0)) {
          puVar8 = (puVar12->tree_entry).rbe_right;
          if ((puVar8 == (uv_signal_s *)0x0) || ((puVar8->tree_entry).rbe_color == 0))
          goto LAB_001b9421;
        }
        else {
          puVar3 = (puVar12->tree_entry).rbe_right;
          if ((puVar3 == (uv_signal_s *)0x0) || ((puVar3->tree_entry).rbe_color == 0)) {
            (puVar8->tree_entry).rbe_color = 0;
            puVar8 = (puVar12->tree_entry).rbe_left;
            (puVar12->tree_entry).rbe_color = 1;
            puVar3 = (puVar8->tree_entry).rbe_right;
            (puVar12->tree_entry).rbe_left = puVar3;
            if (puVar3 != (uv_signal_s *)0x0) {
              (puVar3->tree_entry).rbe_parent = puVar12;
            }
            puVar3 = (puVar12->tree_entry).rbe_parent;
            (puVar8->tree_entry).rbe_parent = puVar3;
            if (puVar3 == (uv_signal_s *)0x0) {
              uVar10.rbh_root = puVar8;
              paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            }
            else {
              paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar3->tree_entry).rbe_right;
              if (puVar12 == (puVar3->tree_entry).rbe_left) {
                paVar13 = &puVar3->tree_entry;
              }
            }
            paVar13->rbe_left = puVar8;
            (puVar8->tree_entry).rbe_right = puVar12;
            (puVar12->tree_entry).rbe_parent = puVar8;
            puVar12 = (puVar11->tree_entry).rbe_right;
          }
        }
        (puVar12->tree_entry).rbe_color = (puVar11->tree_entry).rbe_color;
        (puVar11->tree_entry).rbe_color = 0;
        puVar12 = (puVar12->tree_entry).rbe_right;
        if (puVar12 != (uv_signal_s *)0x0) {
          (puVar12->tree_entry).rbe_color = 0;
        }
        puVar12 = (puVar11->tree_entry).rbe_right;
        puVar8 = (puVar12->tree_entry).rbe_left;
        (puVar11->tree_entry).rbe_right = puVar8;
        if (puVar8 != (uv_signal_s *)0x0) {
          (puVar8->tree_entry).rbe_parent = puVar11;
        }
        puVar8 = (puVar11->tree_entry).rbe_parent;
        (puVar12->tree_entry).rbe_parent = puVar8;
        if (puVar8 == (uv_signal_s *)0x0) {
          uVar10.rbh_root = puVar12;
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        }
        else {
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar8->tree_entry).rbe_right;
          if (puVar11 == (puVar8->tree_entry).rbe_left) {
            paVar13 = &puVar8->tree_entry;
          }
        }
        paVar13->rbe_left = puVar12;
        (puVar12->tree_entry).rbe_left = puVar11;
        goto LAB_001b95c5;
      }
      if ((puVar12->tree_entry).rbe_color == 1) {
        (puVar12->tree_entry).rbe_color = 0;
        (puVar11->tree_entry).rbe_color = 1;
        puVar12 = (puVar11->tree_entry).rbe_left;
        puVar8 = (puVar12->tree_entry).rbe_right;
        (puVar11->tree_entry).rbe_left = puVar8;
        if (puVar8 != (uv_signal_s *)0x0) {
          (puVar8->tree_entry).rbe_parent = puVar11;
        }
        puVar8 = (puVar11->tree_entry).rbe_parent;
        (puVar12->tree_entry).rbe_parent = puVar8;
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
        puVar3 = puVar12;
        if (puVar8 != (uv_signal_s *)0x0) {
          paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar8->tree_entry).rbe_right;
          puVar3 = uVar10.rbh_root;
          if (puVar11 == (puVar8->tree_entry).rbe_left) {
            paVar13 = &puVar8->tree_entry;
          }
        }
        uVar10.rbh_root = puVar3;
        paVar13->rbe_left = puVar12;
        (puVar12->tree_entry).rbe_right = puVar11;
        (puVar11->tree_entry).rbe_parent = puVar12;
        puVar12 = (puVar11->tree_entry).rbe_left;
      }
      puVar8 = (puVar12->tree_entry).rbe_left;
      if ((puVar8 != (uv_signal_s *)0x0) && ((puVar8->tree_entry).rbe_color != 0))
      goto LAB_001b94f2;
      puVar3 = (puVar12->tree_entry).rbe_right;
      if ((puVar3 != (uv_signal_s *)0x0) && ((puVar3->tree_entry).rbe_color != 0)) break;
LAB_001b9421:
      (puVar12->tree_entry).rbe_color = 1;
      puVar8 = puVar11;
      puVar11 = (puVar11->tree_entry).rbe_parent;
    }
    if ((puVar8 == (uv_signal_s *)0x0) || ((puVar8->tree_entry).rbe_color == 0)) {
      (puVar3->tree_entry).rbe_color = 0;
      puVar8 = (puVar12->tree_entry).rbe_right;
      (puVar12->tree_entry).rbe_color = 1;
      puVar3 = (puVar8->tree_entry).rbe_left;
      (puVar12->tree_entry).rbe_right = puVar3;
      if (puVar3 != (uv_signal_s *)0x0) {
        (puVar3->tree_entry).rbe_parent = puVar12;
      }
      puVar3 = (puVar12->tree_entry).rbe_parent;
      (puVar8->tree_entry).rbe_parent = puVar3;
      if (puVar3 == (uv_signal_s *)0x0) {
        uVar10.rbh_root = puVar8;
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
      }
      else {
        paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar3->tree_entry).rbe_right;
        if (puVar12 == (puVar3->tree_entry).rbe_left) {
          paVar13 = &puVar3->tree_entry;
        }
      }
      paVar13->rbe_left = puVar8;
      (puVar8->tree_entry).rbe_left = puVar12;
      (puVar12->tree_entry).rbe_parent = puVar8;
      puVar12 = (puVar11->tree_entry).rbe_left;
    }
LAB_001b94f2:
    (puVar12->tree_entry).rbe_color = (puVar11->tree_entry).rbe_color;
    (puVar11->tree_entry).rbe_color = 0;
    puVar12 = (puVar12->tree_entry).rbe_left;
    if (puVar12 != (uv_signal_s *)0x0) {
      (puVar12->tree_entry).rbe_color = 0;
    }
    puVar12 = (puVar11->tree_entry).rbe_left;
    puVar8 = (puVar12->tree_entry).rbe_right;
    (puVar11->tree_entry).rbe_left = puVar8;
    if (puVar8 != (uv_signal_s *)0x0) {
      (puVar8->tree_entry).rbe_parent = puVar11;
    }
    puVar8 = (puVar11->tree_entry).rbe_parent;
    (puVar12->tree_entry).rbe_parent = puVar8;
    if (puVar8 == (uv_signal_s *)0x0) {
      uVar10.rbh_root = puVar12;
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
    }
    else {
      paVar13 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar8->tree_entry).rbe_right;
      if (puVar11 == (puVar8->tree_entry).rbe_left) {
        paVar13 = &puVar8->tree_entry;
      }
    }
    paVar13->rbe_left = puVar12;
    (puVar12->tree_entry).rbe_right = puVar11;
LAB_001b95c5:
    (puVar11->tree_entry).rbe_parent = puVar12;
    puVar8 = uVar10.rbh_root;
    if (uVar10.rbh_root != (uv_signal_s *)0x0) {
LAB_001b95d1:
      (puVar8->tree_entry).rbe_color = 0;
    }
  }
LAB_001b95d5:
  iVar7 = handle->signum;
  puVar9 = uv__signal_first_handle(iVar7);
  if (puVar9 == (uv_signal_t *)0x0) {
    memset(&local_b0,0,0x98);
    iVar7 = sigaction(iVar7,&local_b0,(sigaction *)0x0);
    if (iVar7 != 0) {
      abort();
    }
  }
  else if ((((puVar9->flags & 0x2000000) != 0) && ((handle->flags & 0x2000000) == 0)) &&
          (iVar7 = uv__signal_register_handler(iVar7,1), iVar7 != 0)) {
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/signal.c"
                  ,0x20b,"void uv__signal_stop(uv_signal_t *)");
  }
  uv__signal_unlock_and_unblock(&saved_sigmask);
  handle->signum = 0;
  uVar2 = handle->flags;
  if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  return;
}

Assistant:

static void uv__signal_stop(uv_signal_t* handle) {
  uv_signal_t* removed_handle;
  sigset_t saved_sigmask;
  uv_signal_t* first_handle;
  int rem_oneshot;
  int first_oneshot;
  int ret;

  /* If the watcher wasn't started, this is a no-op. */
  if (handle->signum == 0)
    return;

  uv__signal_block_and_lock(&saved_sigmask);

  removed_handle = RB_REMOVE(uv__signal_tree_s, &uv__signal_tree, handle);
  assert(removed_handle == handle);
  (void) removed_handle;

  /* Check if there are other active signal watchers observing this signal. If
   * not, unregister the signal handler.
   */
  first_handle = uv__signal_first_handle(handle->signum);
  if (first_handle == NULL) {
    uv__signal_unregister_handler(handle->signum);
  } else {
    rem_oneshot = handle->flags & UV_SIGNAL_ONE_SHOT;
    first_oneshot = first_handle->flags & UV_SIGNAL_ONE_SHOT;
    if (first_oneshot && !rem_oneshot) {
      ret = uv__signal_register_handler(handle->signum, 1);
      assert(ret == 0);
      (void)ret;
    }
  }

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signum = 0;
  uv__handle_stop(handle);
}